

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O0

void __thiscall
Assimp::AMFImporter::Postprocess_BuildConstellation
          (AMFImporter *this,CAMFImporter_NodeElement_Constellation *pConstellation,
          list<aiNode_*,_std::allocator<aiNode_*>_> *pNodeList)

{
  bool bVar1;
  aiNode *paVar2;
  list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *this_00;
  reference ppCVar3;
  aiNode **ppaVar4;
  DeadlyImportError *pDVar5;
  size_type sVar6;
  void *pvVar7;
  reference ppaVar8;
  aiNode *node;
  iterator __end1_1;
  iterator __begin1_1;
  list<aiNode_*,_std::allocator<aiNode_*>_> *__range1_1;
  size_t ch_idx;
  string local_110;
  long local_f0;
  CAMFImporter_NodeElement_Instance *als;
  string local_e0;
  aiNode *local_c0;
  aiNode *found_node;
  aiNode *t_node;
  aiMatrix4x4 tmat;
  CAMFImporter_NodeElement *ne;
  iterator __end1;
  iterator __begin1;
  list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *__range1;
  undefined1 local_40 [8];
  list<aiNode_*,_std::allocator<aiNode_*>_> ch_node;
  aiNode *con_node;
  list<aiNode_*,_std::allocator<aiNode_*>_> *pNodeList_local;
  CAMFImporter_NodeElement_Constellation *pConstellation_local;
  AMFImporter *this_local;
  
  std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::list
            ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_40);
  paVar2 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar2);
  ch_node.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size =
       (size_t)paVar2;
  aiString::operator=((aiString *)paVar2,&(pConstellation->super_CAMFImporter_NodeElement).ID);
  this_00 = &(pConstellation->super_CAMFImporter_NodeElement).Child;
  __end1 = std::__cxx11::
           list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::begin
                     (this_00);
  ne = (CAMFImporter_NodeElement *)
       std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
       end(this_00);
  do {
    bVar1 = std::operator!=(&__end1,(_Self *)&ne);
    if (!bVar1) {
      bVar1 = std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::empty
                        ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_40);
      if (bVar1) {
        ch_idx._6_1_ = 1;
        pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,"<constellation> must have at least one <instance>.",
                   (allocator<char> *)((long)&ch_idx + 7));
        DeadlyImportError::DeadlyImportError(pDVar5,&local_110);
        ch_idx._6_1_ = 0;
        __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      __range1_1 = (list<aiNode_*,_std::allocator<aiNode_*>_> *)0x0;
      sVar6 = std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::size
                        ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_40);
      *(int *)(ch_node.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size
              + 0x450) = (int)sVar6;
      pvVar7 = operator_new__((ulong)*(uint *)(ch_node.
                                               super__List_base<aiNode_*,_std::allocator<aiNode_*>_>
                                               ._M_impl._M_node._M_size + 0x450) << 3);
      *(void **)(ch_node.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
                 _M_size + 0x458) = pvVar7;
      __end1_1 = std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::begin
                           ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_40);
      node = (aiNode *)
             std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::end
                       ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_40);
      while (bVar1 = std::operator!=(&__end1_1,(_Self *)&node), bVar1) {
        ppaVar8 = std::_List_iterator<aiNode_*>::operator*(&__end1_1);
        *(aiNode **)
         (*(long *)(ch_node.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
                    _M_size + 0x458) + (long)__range1_1 * 8) = *ppaVar8;
        std::_List_iterator<aiNode_*>::operator++(&__end1_1);
        __range1_1 = (list<aiNode_*,_std::allocator<aiNode_*>_> *)
                     ((long)&(__range1_1->super__List_base<aiNode_*,_std::allocator<aiNode_*>_>).
                             _M_impl._M_node.super__List_node_base._M_next + 1);
      }
      std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                (pNodeList,
                 (value_type *)
                 &ch_node.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
                  _M_size);
      std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::~list
                ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_40);
      return;
    }
    ppCVar3 = std::_List_iterator<CAMFImporter_NodeElement_*>::operator*(&__end1);
    tmat._56_8_ = *ppCVar3;
    aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&t_node);
    if (*(int *)(tmat._56_8_ + 8) != 6) {
      if (*(int *)(tmat._56_8_ + 8) != 4) {
        als._6_1_ = 1;
        pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,"Only <instance> nodes can be in <constellation>.",
                   (allocator<char> *)((long)&als + 7));
        DeadlyImportError::DeadlyImportError(pDVar5,&local_e0);
        als._6_1_ = 0;
        __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      local_f0._0_4_ = tmat.d3;
      local_f0._4_4_ = tmat.d4;
      bVar1 = Find_ConvertedNode(this,(string *)(tmat._56_8_ + 0x50),pNodeList,&local_c0);
      if (!bVar1) {
        Throw_ID_NotFound(this,(string *)(local_f0 + 0x50));
      }
      paVar2 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar2);
      paVar2->mParent =
           (aiNode *)
           ch_node.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size;
      found_node = paVar2;
      aiMatrix4x4t<float>::Translation
                ((aiVector3t<float> *)(local_f0 + 0x70),(aiMatrix4x4t<float> *)&t_node);
      aiMatrix4x4t<float>::operator*=(&found_node->mTransformation,(aiMatrix4x4t<float> *)&t_node);
      aiMatrix4x4t<float>::RotationX(*(float *)(local_f0 + 0x7c),(aiMatrix4x4t<float> *)&t_node);
      aiMatrix4x4t<float>::operator*=(&found_node->mTransformation,(aiMatrix4x4t<float> *)&t_node);
      aiMatrix4x4t<float>::RotationY(*(float *)(local_f0 + 0x80),(aiMatrix4x4t<float> *)&t_node);
      aiMatrix4x4t<float>::operator*=(&found_node->mTransformation,(aiMatrix4x4t<float> *)&t_node);
      aiMatrix4x4t<float>::RotationZ(*(float *)(local_f0 + 0x84),(aiMatrix4x4t<float> *)&t_node);
      aiMatrix4x4t<float>::operator*=(&found_node->mTransformation,(aiMatrix4x4t<float> *)&t_node);
      found_node->mNumChildren = 1;
      ppaVar4 = (aiNode **)operator_new__((ulong)found_node->mNumChildren << 3);
      found_node->mChildren = ppaVar4;
      SceneCombiner::Copy(found_node->mChildren,local_c0);
      (*found_node->mChildren)->mParent = found_node;
      std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_40,&found_node);
    }
    std::_List_iterator<CAMFImporter_NodeElement_*>::operator++(&__end1);
  } while( true );
}

Assistant:

void AMFImporter::Postprocess_BuildConstellation(CAMFImporter_NodeElement_Constellation& pConstellation, std::list<aiNode*>& pNodeList) const
{
aiNode* con_node;
std::list<aiNode*> ch_node;

	// We will build next hierarchy:
	// aiNode as parent (<constellation>) for set of nodes as a children
	//  |- aiNode for transformation (<instance> -> <delta...>, <r...>) - aiNode for pointing to object ("objectid")
	//  ...
	//  \_ aiNode for transformation (<instance> -> <delta...>, <r...>) - aiNode for pointing to object ("objectid")
	con_node = new aiNode;
	con_node->mName = pConstellation.ID;
	// Walk through children and search for instances of another objects, constellations.
	for(const CAMFImporter_NodeElement* ne: pConstellation.Child)
	{
		aiMatrix4x4 tmat;
		aiNode* t_node;
		aiNode* found_node;

		if(ne->Type == CAMFImporter_NodeElement::ENET_Metadata) continue;
		if(ne->Type != CAMFImporter_NodeElement::ENET_Instance) throw DeadlyImportError("Only <instance> nodes can be in <constellation>.");

		// create alias for conveniance
		CAMFImporter_NodeElement_Instance& als = *((CAMFImporter_NodeElement_Instance*)ne);
		// find referenced object
		if(!Find_ConvertedNode(als.ObjectID, pNodeList, &found_node)) Throw_ID_NotFound(als.ObjectID);

		// create node for applying transformation
		t_node = new aiNode;
		t_node->mParent = con_node;
		// apply transformation
		aiMatrix4x4::Translation(als.Delta, tmat), t_node->mTransformation *= tmat;
		aiMatrix4x4::RotationX(als.Rotation.x, tmat), t_node->mTransformation *= tmat;
		aiMatrix4x4::RotationY(als.Rotation.y, tmat), t_node->mTransformation *= tmat;
		aiMatrix4x4::RotationZ(als.Rotation.z, tmat), t_node->mTransformation *= tmat;
		// create array for one child node
		t_node->mNumChildren = 1;
		t_node->mChildren = new aiNode*[t_node->mNumChildren];
		SceneCombiner::Copy(&t_node->mChildren[0], found_node);
		t_node->mChildren[0]->mParent = t_node;
		ch_node.push_back(t_node);
	}// for(const CAMFImporter_NodeElement* ne: pConstellation.Child)

	// copy found aiNode's as children
	if(ch_node.empty()) throw DeadlyImportError("<constellation> must have at least one <instance>.");

	size_t ch_idx = 0;

	con_node->mNumChildren = static_cast<unsigned int>(ch_node.size());
	con_node->mChildren = new aiNode*[con_node->mNumChildren];
	for(aiNode* node: ch_node) con_node->mChildren[ch_idx++] = node;

	// and place "root" of <constellation> node to node list
	pNodeList.push_back(con_node);
}